

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O3

bool __thiscall cmFileCopier::InstallSymlink(cmFileCopier *this,char *fromFile,char *toFile)

{
  pointer pcVar1;
  char *pcVar2;
  cmCommand *pcVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  size_t sVar7;
  undefined8 uVar8;
  string symlinkTarget;
  ostringstream e;
  undefined1 auStack_1f8 [15];
  allocator local_1e9;
  string local_1e8;
  string local_1c8;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  local_1c8._M_string_length = 0;
  local_1c8.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)local_1a8,fromFile,(allocator *)&local_1e8);
  bVar4 = cmsys::SystemTools::ReadSymlink((string *)local_1a8,&local_1c8);
  pcVar1 = local_1a8 + 0x10;
  if ((pointer)local_1a8._0_8_ != pcVar1) {
    operator_delete((void *)local_1a8._0_8_,CONCAT71(local_1a8._17_7_,local_1a8[0x10]) + 1);
  }
  if (bVar4) {
    uVar8 = 1;
    if (this->Always == false) {
      local_1a8._8_8_ = 0;
      local_1a8[0x10] = '\0';
      local_1a8._0_8_ = pcVar1;
      std::__cxx11::string::string((string *)&local_1e8,toFile,&local_1e9);
      bVar4 = cmsys::SystemTools::ReadSymlink(&local_1e8,(string *)local_1a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
      }
      uVar8 = 1;
      if ((bVar4) && (local_1c8._M_string_length == local_1a8._8_8_)) {
        if (local_1c8._M_string_length != 0) {
          iVar6 = bcmp(local_1c8._M_dataplus._M_p,(void *)local_1a8._0_8_,local_1c8._M_string_length
                      );
          if (iVar6 != 0) goto LAB_002a708f;
        }
        uVar8 = 0;
      }
LAB_002a708f:
      if ((pointer)local_1a8._0_8_ != pcVar1) {
        operator_delete((void *)local_1a8._0_8_,CONCAT71(local_1a8._17_7_,local_1a8[0x10]) + 1);
      }
    }
    (*this->_vptr_cmFileCopier[4])(this,toFile,2,uVar8);
    bVar4 = true;
    if ((char)uVar8 == '\0') goto LAB_002a732b;
    std::__cxx11::string::string((string *)local_1a8,toFile,(allocator *)&local_1e8);
    cmsys::SystemTools::RemoveFile((string *)local_1a8);
    if ((pointer)local_1a8._0_8_ != pcVar1) {
      operator_delete((void *)local_1a8._0_8_,CONCAT71(local_1a8._17_7_,local_1a8[0x10]) + 1);
    }
    std::__cxx11::string::string((string *)&local_1e8,toFile,&local_1e9);
    cmsys::SystemTools::GetFilenamePath((string *)local_1a8,&local_1e8);
    cmsys::SystemTools::MakeDirectory((string *)local_1a8);
    if ((pointer)local_1a8._0_8_ != pcVar1) {
      operator_delete((void *)local_1a8._0_8_,CONCAT71(local_1a8._17_7_,local_1a8[0x10]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::string((string *)local_1a8,toFile,(allocator *)&local_1e8);
    bVar5 = cmsys::SystemTools::CreateSymlink(&local_1c8,(string *)local_1a8);
    if ((pointer)local_1a8._0_8_ != pcVar1) {
      operator_delete((void *)local_1a8._0_8_,CONCAT71(local_1a8._17_7_,local_1a8[0x10]) + 1);
    }
    if (bVar5) goto LAB_002a732b;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    pcVar2 = this->Name;
    if (pcVar2 == (char *)0x0) {
      std::ios::clear((int)auStack_1f8 + (int)*(undefined8 *)(local_1a8._0_8_ + -0x18) + 0x50);
    }
    else {
      sVar7 = strlen(pcVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar2,sVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8," cannot duplicate symlink \"",0x1b);
    if (fromFile == (char *)0x0) {
      std::ios::clear((int)auStack_1f8 + (int)*(undefined8 *)(local_1a8._0_8_ + -0x18) + 0x50);
    }
    else {
      sVar7 = strlen(fromFile);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,fromFile,sVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\" at \"",6);
    if (toFile == (char *)0x0) {
      std::ios::clear((int)auStack_1f8 + (int)*(undefined8 *)(local_1a8._0_8_ + -0x18) + 0x50);
    }
    else {
      sVar7 = strlen(toFile);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,toFile,sVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\".",2);
    pcVar3 = &this->FileCommand->super_cmCommand;
    std::__cxx11::stringbuf::str();
    cmCommand::SetError(pcVar3,&local_1e8);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    pcVar2 = this->Name;
    if (pcVar2 == (char *)0x0) {
      std::ios::clear((int)auStack_1f8 + (int)*(undefined8 *)(local_1a8._0_8_ + -0x18) + 0x50);
    }
    else {
      sVar7 = strlen(pcVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar2,sVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8," cannot read symlink \"",0x16);
    if (fromFile == (char *)0x0) {
      std::ios::clear((int)auStack_1f8 + (int)*(undefined8 *)(local_1a8._0_8_ + -0x18) + 0x50);
    }
    else {
      sVar7 = strlen(fromFile);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,fromFile,sVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"\" to duplicate at \"",0x13);
    if (toFile == (char *)0x0) {
      std::ios::clear((int)auStack_1f8 + (int)*(undefined8 *)(local_1a8._0_8_ + -0x18) + 0x50);
    }
    else {
      sVar7 = strlen(toFile);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,toFile,sVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\".",2);
    pcVar3 = &this->FileCommand->super_cmCommand;
    std::__cxx11::stringbuf::str();
    cmCommand::SetError(pcVar3,&local_1e8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  bVar4 = false;
LAB_002a732b:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,
                    CONCAT71(local_1c8.field_2._M_allocated_capacity._1_7_,
                             local_1c8.field_2._M_local_buf[0]) + 1);
  }
  return bVar4;
}

Assistant:

bool cmFileCopier::InstallSymlink(const char* fromFile, const char* toFile)
{
  // Read the original symlink.
  std::string symlinkTarget;
  if (!cmSystemTools::ReadSymlink(fromFile, symlinkTarget)) {
    std::ostringstream e;
    e << this->Name << " cannot read symlink \"" << fromFile
      << "\" to duplicate at \"" << toFile << "\".";
    this->FileCommand->SetError(e.str());
    return false;
  }

  // Compare the symlink value to that at the destination if not
  // always installing.
  bool copy = true;
  if (!this->Always) {
    std::string oldSymlinkTarget;
    if (cmSystemTools::ReadSymlink(toFile, oldSymlinkTarget)) {
      if (symlinkTarget == oldSymlinkTarget) {
        copy = false;
      }
    }
  }

  // Inform the user about this file installation.
  this->ReportCopy(toFile, TypeLink, copy);

  if (copy) {
    // Remove the destination file so we can always create the symlink.
    cmSystemTools::RemoveFile(toFile);

    // Create destination directory if it doesn't exist
    cmSystemTools::MakeDirectory(cmSystemTools::GetFilenamePath(toFile));

    // Create the symlink.
    if (!cmSystemTools::CreateSymlink(symlinkTarget, toFile)) {
      std::ostringstream e;
      e << this->Name << " cannot duplicate symlink \"" << fromFile
        << "\" at \"" << toFile << "\".";
      this->FileCommand->SetError(e.str());
      return false;
    }
  }

  return true;
}